

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O0

WebPMuxError
ChunkVerifyAndAssign(WebPChunk *chunk,uint8_t *data,size_t data_size,size_t riff_size,int copy_data)

{
  uint32_t uVar1;
  WebPChunk *chunk_00;
  WebPChunk *in_RCX;
  WebPChunk *in_RDX;
  undefined8 in_RDI;
  undefined4 in_R8D;
  size_t chunk_disk_size;
  WebPData chunk_data;
  uint32_t chunk_size;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 local_4;
  
  if (in_RDX < (WebPChunk *)0x8) {
    local_4 = WEBP_MUX_NOT_ENOUGH_DATA;
  }
  else {
    uVar1 = GetLE32((uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (uVar1 < 0xfffffff7) {
      chunk_00 = (WebPChunk *)SizeWithPadding((ulong)uVar1);
      if (in_RCX < chunk_00) {
        local_4 = WEBP_MUX_BAD_DATA;
      }
      else if (in_RDX < chunk_00) {
        local_4 = WEBP_MUX_NOT_ENOUGH_DATA;
      }
      else {
        GetLE32((uint8_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffb0));
        local_4 = ChunkAssignData(chunk_00,(WebPData *)CONCAT44(in_R8D,in_stack_ffffffffffffffb0),
                                  (int)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
      }
    }
    else {
      local_4 = WEBP_MUX_BAD_DATA;
    }
  }
  return local_4;
}

Assistant:

static WebPMuxError ChunkVerifyAndAssign(WebPChunk* chunk,
                                         const uint8_t* data, size_t data_size,
                                         size_t riff_size, int copy_data) {
  uint32_t chunk_size;
  WebPData chunk_data;

  // Correctness checks.
  if (data_size < CHUNK_HEADER_SIZE) return WEBP_MUX_NOT_ENOUGH_DATA;
  chunk_size = GetLE32(data + TAG_SIZE);
  if (chunk_size > MAX_CHUNK_PAYLOAD) return WEBP_MUX_BAD_DATA;

  {
    const size_t chunk_disk_size = SizeWithPadding(chunk_size);
    if (chunk_disk_size > riff_size) return WEBP_MUX_BAD_DATA;
    if (chunk_disk_size > data_size) return WEBP_MUX_NOT_ENOUGH_DATA;
  }

  // Data assignment.
  chunk_data.bytes = data + CHUNK_HEADER_SIZE;
  chunk_data.size = chunk_size;
  return ChunkAssignData(chunk, &chunk_data, copy_data, GetLE32(data + 0));
}